

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::clear(QComboBox *this)

{
  undefined4 uVar1;
  QComboBoxPrivate *pQVar2;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QAccessibleValueChangeEvent event;
  QVariant *val;
  QAbstractItemModel *obj;
  undefined4 in_stack_ffffffffffffff10;
  undefined1 local_b0 [24];
  QPersistentModelIndex local_98 [3];
  undefined1 local_80 [56];
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QComboBox *)0x53bcb0);
  obj = pQVar2->model;
  val = (QVariant *)local_80;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)val);
  uVar1 = (**(code **)(*(long *)obj + 0x78))(obj,val);
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_98);
  (**(code **)(*(long *)obj + 0x108))(obj,0,uVar1,local_98);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x53bd63);
  ::QVariant::QVariant((QVariant *)(local_80 + 0x18),(QString *)local_b0);
  QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)CONCAT44(uVar1,in_stack_ffffffffffffff10),(QObject *)obj
             ,val);
  ::QVariant::~QVariant((QVariant *)(local_80 + 0x18));
  QString::~QString((QString *)0x53bdaa);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::clear()
{
    Q_D(QComboBox);
    d->model->removeRows(0, d->model->rowCount(d->root), d->root);
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(this, QString());
    QAccessible::updateAccessibility(&event);
#endif
}